

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O2

int cache_put(uint64_t a,uint64_t b,uint64_t c,uint64_t res)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  cache_entry_t pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  puVar2 = cache_status;
  uVar6 = (((a >> 0x20 ^ a ^ 0xcbf29ce484222325) * 0x100000001b3 ^ b) * 0x100000001b3 ^ c) *
          0x100000001b3;
  uVar7 = cache_mask & uVar6;
  pcVar3 = cache_table + uVar7;
  uVar1 = cache_status[uVar7];
  iVar4 = 0;
  if (-1 < (int)uVar1) {
    uVar5 = (uint)(uVar6 >> 0x20) & 0x3fff0000;
    uVar8 = uVar1 + 1 & 0xffff;
    LOCK();
    bVar9 = uVar1 == cache_status[uVar7];
    if (bVar9) {
      cache_status[uVar7] = uVar8 + 0x80000000 + uVar5;
    }
    UNLOCK();
    iVar4 = 0;
    if (bVar9) {
      iVar4 = 1;
      pcVar3->a = a;
      pcVar3->b = b;
      pcVar3->c = c;
      pcVar3->res = res;
      puVar2[uVar7] = uVar8 | uVar5;
    }
  }
  return iVar4;
}

Assistant:

int
cache_put(uint64_t a, uint64_t b, uint64_t c, uint64_t res)
{
    const uint64_t hash = cache_hash(a, b, c);
#if CACHE_MASK
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash & cache_mask);
    cache_entry_t bucket = cache_table + (hash & cache_mask);
#else
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash % cache_size);
    cache_entry_t bucket = cache_table + (hash % cache_size);
#endif
    uint32_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked
    if (s & 0x80000000) return 0;
    // abort if hash identical -> no: in iscasmc this occasionally causes timeouts?!
    const uint32_t hash_mask = (hash>>32) & 0x3fff0000;
    // if ((s & 0x7fff0000) == hash_mask) return 0;
    // use cas to claim bucket
    const uint32_t new_s = ((s+1) & 0x0000ffff) | hash_mask;
    if (!atomic_compare_exchange_weak(s_bucket, &s, new_s | 0x80000000)) return 0;
    // cas succesful: write data
    bucket->a = a;
    bucket->b = b;
    bucket->c = c;
    bucket->res = res;
    // after compiler_barrier(), unlock status field
    atomic_store_explicit(s_bucket, new_s, memory_order_release);
    return 1;
}